

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O3

void Io_WriteCellNet(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  char *pcVar2;
  long *plVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  FILE *__stream;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteList.c"
                  ,0xe3,"void Io_WriteCellNet(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar2 = pNtk->pName;
    pcVar8 = Extra_TimeStamp();
    fprintf(__stream,"# CellNet file for network \"%s\" written by ABC on %s\n",pcVar2,pcVar8);
    pVVar9 = pNtk->vPis;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        fprintf(__stream,"cell %d is 0\n",(ulong)*(uint *)((long)pVVar9->pArray[lVar10] + 0x10));
        lVar10 = lVar10 + 1;
        pVVar9 = pNtk->vPis;
      } while (lVar10 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vPos;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        fprintf(__stream,"cell %d is 1\n",(ulong)*(uint *)((long)pVVar9->pArray[lVar10] + 0x10));
        lVar10 = lVar10 + 1;
        pVVar9 = pNtk->vPos;
      } while (lVar10 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vBoxes;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        plVar3 = (long *)pVVar9->pArray[lVar10];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
          fprintf(__stream,"cell %d is 2\n",
                  (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                            (long)*(int *)plVar3[4] * 8) + 0x10));
          pVVar9 = pNtk->vBoxes;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        pvVar4 = pVVar9->pArray[lVar10];
        if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
          fprintf(__stream,"cell %d is %d\n",(ulong)*(uint *)((long)pvVar4 + 0x10),
                  (ulong)(*(int *)((long)pvVar4 + 0x1c) + 3));
          pVVar9 = pNtk->vObjs;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vPis;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        pAVar5 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
        fprintf(__stream,"net %d  %d 0",(ulong)(uint)pAVar5->Id);
        if (0 < (pAVar5->vFanouts).nSize) {
          lVar11 = 0;
          do {
            pAVar6 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanouts).pArray[lVar11]];
            uVar1 = pAVar6->Id;
            iVar7 = Abc_ObjFanoutFaninNum(pAVar6,pAVar5);
            fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar7 + 1));
            lVar11 = lVar11 + 1;
          } while (lVar11 < (pAVar5->vFanouts).nSize);
        }
        fputc(10,__stream);
        lVar10 = lVar10 + 1;
        pVVar9 = pNtk->vPis;
      } while (lVar10 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vBoxes;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        plVar3 = (long *)pVVar9->pArray[lVar10];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
          fprintf(__stream,"net %d  %d 0",
                  (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                            (long)*(int *)plVar3[4] * 8) + 0x10));
          pAVar5 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
          if (0 < (pAVar5->vFanouts).nSize) {
            lVar11 = 0;
            do {
              pAVar6 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanouts).pArray[lVar11]];
              uVar1 = pAVar6->Id;
              iVar7 = Abc_ObjFanoutFaninNum(pAVar6,pAVar5);
              fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar7 + 1));
              lVar11 = lVar11 + 1;
            } while (lVar11 < (pAVar5->vFanouts).nSize);
          }
          fputc(10,__stream);
          pVVar9 = pNtk->vBoxes;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        pAVar5 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
        if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
          fprintf(__stream,"net %d  %d 0",(ulong)(uint)pAVar5->Id);
          if (0 < (pAVar5->vFanouts).nSize) {
            lVar11 = 0;
            do {
              pAVar6 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanouts).pArray[lVar11]];
              uVar1 = pAVar6->Id;
              iVar7 = Abc_ObjFanoutFaninNum(pAVar6,pAVar5);
              fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar7 + 1));
              lVar11 = lVar11 + 1;
            } while (lVar11 < (pAVar5->vFanouts).nSize);
          }
          fputc(10,__stream);
          pVVar9 = pNtk->vObjs;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar9->nSize);
    }
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  fprintf(_stdout,"Io_WriteCellNet(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Io_WriteCellNet( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteCellNet(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fprintf( pFile, "# CellNet file for network \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // the only tricky part with writing is handling latches:
    // each latch comes with (a) single-input latch-input node, (b) latch proper, (c) single-input latch-output node
    // we arbitrarily decide to use the interger ID of the latch-input node to represent the latch in the file
    // (this ID is used for both the cell and the net driven by that cell)

    // write the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 0\n", pObj->Id );
    // write the POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 1\n", pObj->Id );
    // write the latches (use the ID of latch input)
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 2\n", Abc_ObjFanin0(pObj)->Id );
    // write the logic nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        fprintf( pFile, "cell %d is %d\n", pObj->Id, 3+Abc_ObjFaninNum(pObj) );

    // write the nets driven by PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", pObj->Id, pObj->Id );
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }
    // write the nets driven by latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", Abc_ObjFanin0(pObj)->Id, Abc_ObjFanin0(pObj)->Id );
        pObj = Abc_ObjFanout0(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }
    // write the nets driven by nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", pObj->Id, pObj->Id );
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }

	fprintf( pFile, "\n" );
	fclose( pFile );
}